

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_simple_mcc_decorrelation_data_t *poVar1;
  long lVar2;
  uint uVar3;
  undefined8 in_RAX;
  opj_mct_data_t *poVar4;
  OPJ_BYTE *__dest;
  char *pcVar5;
  OPJ_BOOL OVar6;
  uint uVar7;
  long lVar8;
  opj_mct_data_t *poVar9;
  opj_tcp_t *poVar10;
  uint uVar11;
  OPJ_UINT32 l_tmp;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x15df,
                  "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x15e0,
                  "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar10 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar10 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_0011757d:
    pcVar5 = "Error reading MCT marker\n";
LAB_00117584:
    OVar6 = 0;
    opj_event_msg(p_manager,1,pcVar5);
  }
  else {
    opj_read_bytes_LE(p_header_data,&local_34,2);
    if (local_34 == 0) {
      if (p_header_size < 7) goto LAB_0011757d;
      opj_read_bytes_LE(p_header_data + 2,&local_34,2);
      poVar9 = poVar10->m_mct_records;
      uVar11 = poVar10->m_nb_mct_records;
      uVar3 = 0;
      uVar7 = local_34 & 0xff;
      poVar4 = poVar9;
      if (uVar11 != 0) {
        do {
          if (poVar4->m_index == uVar7) goto LAB_0011762a;
          poVar4 = poVar4 + 1;
          uVar3 = uVar3 + 1;
        } while (uVar11 != uVar3);
LAB_00117632:
        if (uVar11 != poVar10->m_nb_max_mct_records) {
LAB_001176ed:
          poVar4 = poVar9 + uVar11;
          poVar10->m_nb_mct_records = uVar11 + 1;
          goto LAB_00117700;
        }
        poVar10->m_nb_max_mct_records = uVar11 + 10;
        poVar4 = (opj_mct_data_t *)opj_realloc(poVar9,(ulong)(uVar11 + 10) << 5);
        poVar9 = poVar10->m_mct_records;
        if (poVar4 != (opj_mct_data_t *)0x0) {
          if ((poVar4 != poVar9) && (uVar11 = poVar10->m_nb_mcc_records, (ulong)uVar11 != 0)) {
            poVar1 = poVar10->m_mcc_records;
            lVar8 = 0;
            do {
              lVar2 = *(long *)((long)&poVar1->m_decorrelation_array + lVar8);
              if (lVar2 != 0) {
                *(long *)((long)&poVar1->m_decorrelation_array + lVar8) =
                     (lVar2 - (long)poVar9) + (long)poVar4;
              }
              lVar2 = *(long *)((long)&poVar1->m_offset_array + lVar8);
              if (lVar2 != 0) {
                *(long *)((long)&poVar1->m_offset_array + lVar8) =
                     (lVar2 - (long)poVar9) + (long)poVar4;
              }
              lVar8 = lVar8 + 0x20;
            } while ((ulong)uVar11 << 5 != lVar8);
          }
          poVar10->m_mct_records = poVar4;
          memset(poVar4 + poVar10->m_nb_mct_records,0,
                 (ulong)(poVar10->m_nb_max_mct_records - poVar10->m_nb_mct_records) << 5);
          poVar9 = poVar10->m_mct_records;
          uVar11 = poVar10->m_nb_mct_records;
          goto LAB_001176ed;
        }
        opj_free(poVar9);
        poVar10->m_mct_records = (opj_mct_data_t *)0x0;
        poVar10->m_nb_mct_records = 0;
        poVar10->m_nb_max_mct_records = 0;
        pcVar5 = "Not enough memory to read MCT marker\n";
        goto LAB_00117584;
      }
LAB_0011762a:
      if (uVar3 == uVar11) goto LAB_00117632;
LAB_00117700:
      if (poVar4->m_data != (OPJ_BYTE *)0x0) {
        opj_free(poVar4->m_data);
        poVar4->m_data = (OPJ_BYTE *)0x0;
        poVar4->m_data_size = 0;
      }
      poVar4->m_index = uVar7;
      poVar4->m_array_type = local_34 >> 8 & (MCT_TYPE_OFFSET|MCT_TYPE_DECORRELATION);
      poVar4->m_element_type = local_34 >> 10 & MCT_TYPE_DOUBLE;
      opj_read_bytes_LE(p_header_data + 4,&local_34,2);
      if (local_34 != 0) {
        pcVar5 = "Cannot take in charge multiple MCT markers\n";
        goto LAB_001175ba;
      }
      uVar11 = p_header_size - 6;
      __dest = (OPJ_BYTE *)opj_malloc((ulong)uVar11);
      poVar4->m_data = __dest;
      if (__dest == (OPJ_BYTE *)0x0) goto LAB_0011757d;
      memcpy(__dest,p_header_data + 6,(ulong)uVar11);
      poVar4->m_data_size = uVar11;
    }
    else {
      pcVar5 = "Cannot take in charge mct data within multiple MCT records\n";
LAB_001175ba:
      opj_event_msg(p_manager,2,pcVar5);
    }
    OVar6 = 1;
  }
  return OVar6;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 i;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_tmp;
    OPJ_UINT32 l_indix;
    opj_mct_data_t * l_mct_data;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);

    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* first marker */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Zmct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge mct data within multiple MCT records\n");
        return OPJ_TRUE;
    }

    if (p_header_size <= 6) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Imct */
    p_header_data += 2;

    l_indix = l_tmp & 0xff;
    l_mct_data = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {
        if (l_mct_data->m_index == l_indix) {
            break;
        }
        ++l_mct_data;
    }

    /* NOT FOUND */
    if (i == l_tcp->m_nb_mct_records) {
        if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
            opj_mct_data_t *new_mct_records;
            l_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;

            new_mct_records = (opj_mct_data_t *) opj_realloc(l_tcp->m_mct_records,
                              l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
            if (! new_mct_records) {
                opj_free(l_tcp->m_mct_records);
                l_tcp->m_mct_records = NULL;
                l_tcp->m_nb_max_mct_records = 0;
                l_tcp->m_nb_mct_records = 0;
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCT marker\n");
                return OPJ_FALSE;
            }

            /* Update m_mcc_records[].m_offset_array and m_decorrelation_array
             * to point to the new addresses */
            if (new_mct_records != l_tcp->m_mct_records) {
                for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {
                    opj_simple_mcc_decorrelation_data_t* l_mcc_record =
                        &(l_tcp->m_mcc_records[i]);
                    if (l_mcc_record->m_decorrelation_array) {
                        l_mcc_record->m_decorrelation_array =
                            new_mct_records +
                            (l_mcc_record->m_decorrelation_array -
                             l_tcp->m_mct_records);
                    }
                    if (l_mcc_record->m_offset_array) {
                        l_mcc_record->m_offset_array =
                            new_mct_records +
                            (l_mcc_record->m_offset_array -
                             l_tcp->m_mct_records);
                    }
                }
            }

            l_tcp->m_mct_records = new_mct_records;
            l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
            memset(l_mct_data, 0, (l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) *
                   sizeof(opj_mct_data_t));
        }

        l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
        ++l_tcp->m_nb_mct_records;
    }

    if (l_mct_data->m_data) {
        opj_free(l_mct_data->m_data);
        l_mct_data->m_data = 00;
        l_mct_data->m_data_size = 0;
    }

    l_mct_data->m_index = l_indix;
    l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
    l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Ymct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple MCT markers\n");
        return OPJ_TRUE;
    }

    p_header_size -= 6;

    l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
    if (! l_mct_data->m_data) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }
    memcpy(l_mct_data->m_data, p_header_data, p_header_size);

    l_mct_data->m_data_size = p_header_size;

    return OPJ_TRUE;
}